

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.cpp
# Opt level: O2

header_info *
anon_unknown.dwarf_7b780::sec_websocket_version
          (header_info *__return_storage_ptr__,header_info *hi,string *value)

{
  byte bVar1;
  undefined8 in_RAX;
  type tVar2;
  size_type sVar3;
  maybe<unsigned_int,_void> local_18;
  
  tVar2 = (type)0x0;
  sVar3 = 0;
  do {
    if (value->_M_string_length == sVar3) {
      local_18._1_7_ = SUB87((ulong)in_RAX >> 8,0);
      local_18.valid_ = true;
      local_18.storage_ = tVar2;
LAB_00116ab1:
      pstore::maybe<unsigned_int,_void>::operator=(&hi->websocket_version,&local_18);
      pstore::http::header_info::header_info(__return_storage_ptr__,hi);
      return __return_storage_ptr__;
    }
    bVar1 = (value->_M_dataplus)._M_p[sVar3];
    if ((bVar1 - 0x3a < 0xfffffff6) || (0x1999998f < (uint)tVar2)) {
      local_18.valid_ = false;
      local_18._1_3_ = 0;
      local_18.storage_ = (type)0x0;
      goto LAB_00116ab1;
    }
    if ((char)bVar1 < '0') {
      pstore::assert_failed
                ("v[pos] >= \'0\'",
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/http/headers.cpp"
                 ,0x7f);
    }
    tVar2 = (type)(((int)tVar2 * 10 + (uint)bVar1) - 0x30);
    sVar3 = sVar3 + 1;
  } while( true );
}

Assistant:

header_info sec_websocket_version (header_info hi, std::string const & value) {
        auto str_to_num = [] (std::string const & v) {
            auto pos = std::string::size_type{0};
            auto const last = v.length ();
            auto num = 0U;
            for (; pos < last && std::isdigit (static_cast<unsigned char> (v[pos])); ++pos) {
                if (num > std::numeric_limits<unsigned>::max () / 10U - 10U) {
                    break; // overflow.
                }
                PSTORE_ASSERT (v[pos] >= '0');
                num = num * 10U + static_cast<unsigned> (v[pos] - '0');
            }
            return pos == last ? pstore::just (num) : pstore::nothing<unsigned> ();
        };

        hi.websocket_version = str_to_num (value);
        return hi;
    }